

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  char cVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  void *this_00;
  undefined8 uVar7;
  ulong uStack_20;
  char c;
  size_t i;
  ostream *os_local;
  XmlEncode *this_local;
  
  for (uStack_20 = 0; uVar4 = std::__cxx11::string::size(), uStack_20 < uVar4;
      uStack_20 = uStack_20 + 1) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this);
    cVar1 = *pcVar5;
    switch(cVar1) {
    case '\"':
      if (this->m_forWhat == ForAttributes) {
        std::operator<<(os,"&quot;");
      }
      else {
        std::operator<<(os,cVar1);
      }
      break;
    default:
      if ((((cVar1 < '\0') || ('\b' < cVar1)) && ((cVar1 < '\x0e' || ('\x1f' < cVar1)))) &&
         (cVar1 != '\x7f')) {
        std::operator<<(os,cVar1);
      }
      else {
        poVar6 = std::operator<<(os,"\\x");
        this_00 = (void *)std::ostream::operator<<(poVar6,std::uppercase);
        uVar7 = std::ostream::operator<<(this_00,std::hex);
        _Var2 = std::setfill<char>('0');
        poVar6 = std::operator<<(uVar7,_Var2._M_c);
        _Var3 = std::setw(2);
        poVar6 = std::operator<<(poVar6,_Var3);
        std::ostream::operator<<(poVar6,(int)cVar1);
      }
      break;
    case '&':
      std::operator<<(os,"&amp;");
      break;
    case '<':
      std::operator<<(os,"&lt;");
      break;
    case '>':
      if (((uStack_20 < 3) ||
          (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar5 != ']')) ||
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar5 != ']')) {
        std::operator<<(os,cVar1);
      }
      else {
        std::operator<<(os,"&gt;");
      }
    }
  }
  return;
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465 and
                        // by @mrpi PR #588
                        if ( ( c >= 0 && c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' ) {
                            // see http://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
                            os << "\\x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
                               << static_cast<int>( c );
                        }
                        else
                            os << c;
                }
            }
        }